

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCompleteGraphsBenchmark.cpp
# Opt level: O1

double __thiscall
PathCompleteGraphsBenchmark::getDeletionsTime
          (PathCompleteGraphsBenchmark *this,unsigned_long deletions)

{
  DynamicGraph *this_00;
  size_t *psVar1;
  size_t sVar2;
  _Base_ptr p_Var3;
  iterator iVar4;
  unsigned_long uVar5;
  int iVar6;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *peVar7;
  _Rb_tree_node_base *p_Var8;
  clock_t cVar9;
  clock_t cVar10;
  long lVar11;
  DynamicGraph *pDVar12;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *peVar13;
  long lVar14;
  _Rb_tree_header *p_Var15;
  vector<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  edges;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *local_78;
  iterator iStack_70;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> *local_68;
  edge_desc_impl<boost::undirected_tag,_unsigned_long> local_58;
  unsigned_long local_40;
  unsigned_long local_38;
  
  local_78 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  iStack_70._M_current = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  local_68 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0;
  this_00 = &(this->super_Benchmark).G;
  pDVar12 = this_00;
  local_40 = deletions;
  do {
    pDVar12 = *(DynamicGraph **)
               &(pDVar12->super_UndirectedGraph).super_type.m_edges.
                super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
                ._M_impl._M_node.super__List_node_base;
    if (pDVar12 == this_00) break;
    local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
         (pDVar12->super_UndirectedGraph).super_type.m_edges.
         super__List_base<boost::list_edge<unsigned_long,_boost::no_property>,_std::allocator<boost::list_edge<unsigned_long,_boost::no_property>_>_>
         ._M_impl._M_node._M_size;
    local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
         (unsigned_long)
         (pDVar12->super_UndirectedGraph).super_type.m_vertices.
         super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58.m_eproperty =
         &(pDVar12->super_UndirectedGraph).super_type.m_vertices.
          super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config::stored_vertex>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    if (iStack_70._M_current == local_68) {
      std::
      vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
      ::_M_realloc_insert<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>
                ((vector<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>>>
                  *)&local_78,iStack_70,&local_58);
    }
    else {
      (iStack_70._M_current)->m_eproperty = local_58.m_eproperty;
      ((iStack_70._M_current)->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source =
           local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
      ((iStack_70._M_current)->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target =
           local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      iStack_70._M_current = iStack_70._M_current + 1;
    }
    deletions = deletions - 1;
  } while (deletions != 0);
  iVar4._M_current = iStack_70._M_current;
  peVar13 = local_78;
  if ((local_78 != iStack_70._M_current) && (local_78 + 1 != iStack_70._M_current)) {
    lVar14 = 0x18;
    do {
      iVar6 = rand();
      lVar11 = (long)iVar6 % ((lVar14 >> 3) * -0x5555555555555555 + 1);
      if (lVar14 != lVar11 * 0x18) {
        psVar1 = (size_t *)
                 ((long)&(peVar13->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source +
                 lVar14);
        peVar7 = peVar13 + lVar11;
        local_58.m_eproperty = (property_type *)psVar1[2];
        local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = *psVar1;
        local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target = psVar1[1];
        psVar1[2] = (size_t)peVar7->m_eproperty;
        sVar2 = (peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
        *psVar1 = (peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
        psVar1[1] = sVar2;
        peVar7->m_eproperty = local_58.m_eproperty;
        (peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source =
             local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
        (peVar7->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target =
             local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
      }
      peVar7 = (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)
               ((long)&peVar13[1].super_edge_base<boost::undirected_tag,_unsigned_long>.m_source +
               lVar14);
      lVar14 = lVar14 + 0x18;
    } while (peVar7 != iVar4._M_current);
  }
  uVar5 = local_40;
  p_Var8 = (this->deletionSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var15 = &(this->deletionSet)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var15 && local_40 != 0) {
    do {
      local_78->m_eproperty = p_Var8[1]._M_left;
      p_Var3 = p_Var8[1]._M_parent;
      (local_78->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source =
           *(unsigned_long *)(p_Var8 + 1);
      (local_78->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target =
           (unsigned_long)p_Var3;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      if (uVar5 == 0) break;
    } while ((_Rb_tree_header *)p_Var8 != p_Var15);
  }
  cVar9 = clock();
  if (local_78 != iStack_70._M_current) {
    peVar13 = local_78;
    do {
      local_58.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
           (peVar13->super_edge_base<boost::undirected_tag,_unsigned_long>).m_source;
      local_38 = (peVar13->super_edge_base<boost::undirected_tag,_unsigned_long>).m_target;
      DynamicGraph::deleteEdge(this_00,(Vertex *)&local_58,&local_38);
      peVar13 = peVar13 + 1;
    } while (peVar13 != iStack_70._M_current);
  }
  cVar10 = clock();
  if (local_78 != (edge_desc_impl<boost::undirected_tag,_unsigned_long> *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return (double)(cVar10 - cVar9) / 1000000.0;
}

Assistant:

double PathCompleteGraphsBenchmark::getDeletionsTime(unsigned long deletions)
{
    int deletionsCount = 0;
    std::vector<Edge> edges;

    EdgeIterator ei, ei_end;
    for(boost::tie(ei, ei_end) = boost::edges(G); ei != ei_end; ++ei) {
        edges.push_back(*ei);
        deletionsCount++;
        if (deletionsCount==deletions) {
            break;
        }
    }

    std::random_shuffle(edges.begin(), edges.end());

    // put the edges connecting the complete subgraphs at the beginning
    int counter = 0;
    for (auto i=this->deletionSet.begin(); i!=this->deletionSet.end(); ++i) {
        if (counter>=deletions) break;
        edges[counter] = *i;
    }

    clock_t begin = clock();
    for(auto e = edges.begin(); e!=edges.end(); ++e) {
        G.deleteEdge(boost::source(*e, G), boost::target(*e, G));
    }
    clock_t end = clock();
    double elapsed_secs = double(end-begin) / CLOCKS_PER_SEC;
    return elapsed_secs;
}